

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_rsa_initPEM
              (LIBSSH2_SESSION *session,char *privkeyfile,uchar *passphrase,void **abstract)

{
  int iVar1;
  RSA *pRStack_38;
  int ret;
  RSA *rsactx;
  void **abstract_local;
  uchar *passphrase_local;
  char *privkeyfile_local;
  LIBSSH2_SESSION *session_local;
  
  rsactx = (RSA *)abstract;
  abstract_local = (void **)passphrase;
  passphrase_local = (uchar *)privkeyfile;
  privkeyfile_local = (char *)session;
  if (*abstract != (void *)0x0) {
    hostkey_method_ssh_rsa_dtor(session,abstract);
    *(undefined8 *)rsactx = 0;
  }
  iVar1 = _libssh2_rsa_new_private
                    (&stack0xffffffffffffffc8,(LIBSSH2_SESSION *)privkeyfile_local,
                     (char *)passphrase_local,(uchar *)abstract_local);
  if (iVar1 == 0) {
    *(RSA **)rsactx = pRStack_38;
    session_local._4_4_ = 0;
  }
  else {
    session_local._4_4_ = -1;
  }
  return session_local._4_4_;
}

Assistant:

static int
hostkey_method_ssh_rsa_initPEM(LIBSSH2_SESSION * session,
                               const char *privkeyfile,
                               unsigned const char *passphrase,
                               void **abstract)
{
    libssh2_rsa_ctx *rsactx;
    int ret;

    if (*abstract) {
        hostkey_method_ssh_rsa_dtor(session, abstract);
        *abstract = NULL;
    }

    ret = _libssh2_rsa_new_private(&rsactx, session, privkeyfile, passphrase);
    if (ret) {
        return -1;
    }

    *abstract = rsactx;

    return 0;
}